

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::LocalPipeline::~LocalPipeline(LocalPipeline *this)

{
  CallContextHook *pCVar1;
  Disposer *pDVar2;
  
  pCVar1 = (this->context).ptr;
  if (pCVar1 != (CallContextHook *)0x0) {
    (this->context).ptr = (CallContextHook *)0x0;
    pDVar2 = (this->context).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar1->_vptr_CallContextHook[-2] + (long)&pCVar1->_vptr_CallContextHook);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x48);
  return;
}

Assistant:

inline LocalPipeline(kj::Own<CallContextHook>&& contextParam)
      : context(kj::mv(contextParam)),
        results(context->getResults(MessageSize { 0, 0 })) {}